

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *p_v,void *p_min,void *p_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  uint local_5c;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  ImU32 v32_1;
  bool r;
  ImGuiContext *pIStack_40;
  ImS32 v32;
  ImGuiContext *g;
  void *p_max_local;
  void *p_min_local;
  void *p_v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  if ((flags == 1) || (bVar1 = false, (flags & 0x7000000fU) == 0)) {
    bVar1 = true;
  }
  g = (ImGuiContext *)p_max;
  p_max_local = p_min;
  p_min_local = p_v;
  p_v_local._0_4_ = data_type;
  p_v_local._4_4_ = id;
  _data_type_local = bb;
  if (!bVar1) {
    __assert_fail("(flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && \"Invalid ImGuiSliderFlags flag!  Has the \'float power\' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0xb4e,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                 );
  }
  pIStack_40 = GImGui;
  if ((((GImGui->LastItemData).InFlags & 0x80U) == 0) && ((flags & 0x200000U) == 0)) {
    switch(data_type) {
    case 0:
      v32_1 = (ImU32)*p_v;
      bb_local._7_1_ =
           SliderBehaviorT<int,int,float>
                     (bb,id,4,(int *)&v32_1,(int)*p_min,(int)*p_max,format,flags,out_grab_bb);
      if (bb_local._7_1_) {
        *(char *)p_min_local = (char)v32_1;
      }
      break;
    case 1:
      v32_2 = (ImS32)*p_v;
      bb_local._7_1_ =
           SliderBehaviorT<unsigned_int,int,float>
                     (bb,id,5,(uint *)&v32_2,(uint)*p_min,(uint)*p_max,format,flags,out_grab_bb);
      if (bb_local._7_1_) {
        *(char *)p_min_local = (char)v32_2;
      }
      break;
    case 2:
      v32_3 = (ImU32)*p_v;
      bb_local._7_1_ =
           SliderBehaviorT<int,int,float>
                     (bb,id,4,(int *)&v32_3,(int)*p_min,(int)*p_max,format,flags,out_grab_bb);
      if (bb_local._7_1_) {
        *(short *)p_min_local = (short)v32_3;
      }
      break;
    case 3:
      local_5c = (uint)*p_v;
      bb_local._7_1_ =
           SliderBehaviorT<unsigned_int,int,float>
                     (bb,id,5,&local_5c,(uint)*p_min,(uint)*p_max,format,flags,out_grab_bb);
      if (bb_local._7_1_) {
        *(short *)p_min_local = (short)local_5c;
      }
      break;
    case 4:
      bVar1 = false;
      if (-0x40000001 < *p_min) {
        bVar1 = *p_max < 0x40000000;
      }
      if (!bVar1) {
        __assert_fail("*(const ImS32*)p_min >= IM_S32_MIN / 2 && *(const ImS32*)p_max <= IM_S32_MAX / 2"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xb5b,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      bb_local._7_1_ =
           SliderBehaviorT<int,int,float>
                     (bb,id,data_type,(int *)p_v,*p_min,*p_max,format,flags,out_grab_bb);
      break;
    case 5:
      if (0x7fffffff < *p_max) {
        __assert_fail("*(const ImU32*)p_max <= IM_U32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xb5e,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      bb_local._7_1_ =
           SliderBehaviorT<unsigned_int,int,float>
                     (bb,id,data_type,(uint *)p_v,*p_min,*p_max,format,flags,out_grab_bb);
      break;
    case 6:
      bVar1 = false;
      if (-0x4000000000000001 < *p_min) {
        bVar1 = *p_max < 0x4000000000000000;
      }
      if (!bVar1) {
        __assert_fail("*(const ImS64*)p_min >= IM_S64_MIN / 2 && *(const ImS64*)p_max <= IM_S64_MAX / 2"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xb61,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      bb_local._7_1_ =
           SliderBehaviorT<long_long,long_long,double>
                     (bb,id,data_type,(longlong *)p_v,*p_min,*p_max,format,flags,out_grab_bb);
      break;
    case 7:
      if (0x7fffffffffffffff < *p_max) {
        __assert_fail("*(const ImU64*)p_max <= IM_U64_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xb64,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      bb_local._7_1_ =
           SliderBehaviorT<unsigned_long_long,long_long,double>
                     (bb,id,data_type,(unsigned_long_long *)p_v,*p_min,*p_max,format,flags,
                      out_grab_bb);
      break;
    case 8:
      bVar1 = false;
      if (-1.7014117e+38 <= *p_min) {
        bVar1 = *p_max <= 1.7014117e+38;
      }
      if (!bVar1) {
        __assert_fail("*(const float*)p_min >= -3.40282347e+38F / 2.0f && *(const float*)p_max <= 3.40282347e+38F / 2.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xb67,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      bb_local._7_1_ =
           SliderBehaviorT<float,float,float>
                     (bb,id,data_type,(float *)p_v,*p_min,*p_max,format,flags,out_grab_bb);
      break;
    case 9:
      bVar1 = false;
      if (-8.988465674311579e+307 <= *p_min) {
        bVar1 = *p_max <= 8.988465674311579e+307;
      }
      if (!bVar1) {
        __assert_fail("*(const double*)p_min >= -1.7976931348623157e+308 / 2.0f && *(const double*)p_max <= 1.7976931348623157e+308 / 2.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xb6a,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      bb_local._7_1_ =
           SliderBehaviorT<double,double,double>
                     (bb,id,data_type,(double *)p_v,*p_min,*p_max,format,flags,out_grab_bb);
      break;
    case 10:
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                    ,0xb6e,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                   );
    }
  }
  else {
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* p_v, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    // Read imgui.cpp "API BREAKING CHANGES" section for 1.78 if you hit this assert.
    IM_ASSERT((flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && "Invalid ImGuiSliderFlags flag!  Has the 'float power' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.");

    ImGuiContext& g = *GImGui;
    if ((g.LastItemData.InFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:  { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS8*)p_min,  *(const ImS8*)p_max,  format, flags, out_grab_bb); if (r) *(ImS8*)p_v  = (ImS8)v32;  return r; }
    case ImGuiDataType_U8:  { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU8*)p_min,  *(const ImU8*)p_max,  format, flags, out_grab_bb); if (r) *(ImU8*)p_v  = (ImU8)v32;  return r; }
    case ImGuiDataType_S16: { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS16*)p_min, *(const ImS16*)p_max, format, flags, out_grab_bb); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16: { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU16*)p_min, *(const ImU16*)p_max, format, flags, out_grab_bb); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)p_min >= IM_S32_MIN / 2 && *(const ImS32*)p_max <= IM_S32_MAX / 2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)p_v,  *(const ImS32*)p_min,  *(const ImS32*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)p_max <= IM_U32_MAX / 2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)p_v,  *(const ImU32*)p_min,  *(const ImU32*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)p_min >= IM_S64_MIN / 2 && *(const ImS64*)p_max <= IM_S64_MAX / 2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)p_v,  *(const ImS64*)p_min,  *(const ImS64*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)p_max <= IM_U64_MAX / 2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)p_v,  *(const ImU64*)p_min,  *(const ImU64*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)p_min >= -FLT_MAX / 2.0f && *(const float*)p_max <= FLT_MAX / 2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)p_v,  *(const float*)p_min,  *(const float*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)p_min >= -DBL_MAX / 2.0f && *(const double*)p_max <= DBL_MAX / 2.0f);
        return SliderBehaviorT<double, double, double>(bb, id, data_type, (double*)p_v, *(const double*)p_min, *(const double*)p_max, format, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}